

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  ushort uVar5;
  basic_node_ptr<unodb::detail::olc_node_header> bVar6;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar7;
  ushort uVar8;
  optimistic_lock *poVar9;
  find_result fVar10;
  __atomic_base<unsigned_long> local_78;
  write_guard node_guard;
  write_guard local_50;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard child_guard;
  
  fVar10 = basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
           ::find_child(&inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>
                        ,key_byte);
  piVar7 = fVar10.second;
  if (piVar7 == (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 *)0x0) {
    poVar9 = parent_critical_section->lock;
    if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_00180080:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    if ((parent_critical_section->version).version !=
        (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) goto LAB_0017ff79;
    LOCK();
    paVar1 = &poVar9->read_lock_count;
    lVar2 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_0018009f:
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
    parent_critical_section->lock = (optimistic_lock *)0x0;
    poVar9 = node_critical_section->lock;
    if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00180080;
    if ((node_critical_section->version).version ==
        (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
      LOCK();
      paVar1 = &poVar9->read_lock_count;
      lVar2 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0018009f;
      node_critical_section->lock = (optimistic_lock *)0x0;
LAB_0017ff5c:
      uVar8 = 0x100;
      uVar5 = 0;
      goto LAB_0017ff62;
    }
    optimistic_lock::dec_read_lock_count(poVar9);
    node_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    child->tagged_ptr = (piVar7->value)._M_i.tagged_ptr;
    bVar4 = optimistic_lock::read_critical_section::check(node_critical_section);
    if (bVar4) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff88);
      child_critical_section->lock = (optimistic_lock *)local_78._M_i;
      local_78._M_i = 0;
      (child_critical_section->version).version = (version_tag_type)node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffff88);
      if (child_critical_section->lock != (optimistic_lock *)0x0) {
        uVar3 = child->tagged_ptr;
        *child_type = (node_type)uVar3 & (I256|I48);
        if ((uVar3 & 7) == 0) {
          bVar4 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::matches
                            ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                             (uVar3 & 0xfffffffffffffff8),(art_key_type)k.field_0);
          if (bVar4) {
            if ((inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).
                field_0x20 != '\x02') {
              poVar9 = parent_critical_section->lock;
              if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00180080;
              if ((parent_critical_section->version).version ==
                  (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                paVar1 = &poVar9->read_lock_count;
                lVar2 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_0018009f;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                local_78._M_i =
                     (__int_type_conflict)
                     optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
                if ((optimistic_lock *)local_78._M_i == (optimistic_lock *)0x0) {
                  uVar8 = 0;
                }
                else {
                  node_guard_1.lock =
                       optimistic_lock::write_guard::try_lock_upgrade(child_critical_section);
                  if (node_guard_1.lock == (optimistic_lock *)0x0) {
                    uVar8 = 0;
                    node_guard_1.lock = (optimistic_lock *)0x0;
                  }
                  else {
                    optimistic_lock::write_unlock_and_obsolete(node_guard_1.lock);
                    node_guard_1.lock = (optimistic_lock *)0x0;
                    olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::remove(inode,(char *)(ulong)fVar10.first);
                    *child_in_parent =
                         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                          *)0x0;
                    uVar8 = 0x100;
                  }
                  optimistic_lock::write_guard::~write_guard(&node_guard_1);
                }
                optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff88);
                goto LAB_0017fec6;
              }
              goto LAB_0017ff79;
            }
            node_guard_1.lock =
                 optimistic_lock::write_guard::try_lock_upgrade(parent_critical_section);
            if (node_guard_1.lock != (optimistic_lock *)0x0) {
              child_guard_1.lock =
                   optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
              if (child_guard_1.lock != (optimistic_lock *)0x0) {
                local_50.lock =
                     optimistic_lock::write_guard::try_lock_upgrade(child_critical_section);
                if (local_50.lock != (optimistic_lock *)0x0) {
                  local_78._M_i = (__int_type_conflict)db_instance;
                  node_guard.lock = (optimistic_lock *)inode;
                  optimistic_lock::write_unlock_and_obsolete(child_guard_1.lock);
                  child_guard_1.lock = (optimistic_lock *)0x0;
                  optimistic_lock::write_unlock_and_obsolete(local_50.lock);
                  local_50.lock = (optimistic_lock *)0x0;
                  bVar6 = olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                          ::leave_last_child(inode,fVar10.first,db_instance);
                  (node_in_parent->value)._M_i.tagged_ptr = bVar6.tagged_ptr;
                  if (child_guard_1.lock != (optimistic_lock *)0x0) {
                    __assert_fail("!node_guard.active()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x62e,
                                  "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                                 );
                  }
                  if (local_50.lock != (optimistic_lock *)0x0) {
                    __assert_fail("!child_guard.active()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                  ,0x62f,
                                  "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                                 );
                  }
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  std::
                  unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 *)&stack0xffffffffffffff88);
                  optimistic_lock::write_guard::~write_guard(&local_50);
                  optimistic_lock::write_guard::~write_guard(&child_guard_1);
                  optimistic_lock::write_guard::~write_guard(&node_guard_1);
                  LOCK();
                  (db_instance->shrinking_inode_counts)._M_elems[0].
                  super___atomic_base<unsigned_long>._M_i =
                       (db_instance->shrinking_inode_counts)._M_elems[0].
                       super___atomic_base<unsigned_long>._M_i + 1;
                  UNLOCK();
                  goto LAB_0017fda0;
                }
                optimistic_lock::write_guard::~write_guard(&local_50);
              }
              optimistic_lock::write_guard::~write_guard(&child_guard_1);
            }
            optimistic_lock::write_guard::~write_guard(&node_guard_1);
          }
          else {
            poVar9 = parent_critical_section->lock;
            if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00180080;
            if ((parent_critical_section->version).version !=
                (poVar9->version).version.super___atomic_base<unsigned_long>._M_i)
            goto LAB_0017ff79;
            LOCK();
            paVar1 = &poVar9->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0018009f;
            parent_critical_section->lock = (optimistic_lock *)0x0;
            poVar9 = node_critical_section->lock;
            if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00180080;
            if ((node_critical_section->version).version ==
                (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
              LOCK();
              paVar1 = &poVar9->read_lock_count;
              lVar2 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_0018009f;
              node_critical_section->lock = (optimistic_lock *)0x0;
              poVar9 = child_critical_section->lock;
              if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00180080;
              node_critical_section = child_critical_section;
              if ((child_critical_section->version).version ==
                  (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
                LOCK();
                paVar1 = &poVar9->read_lock_count;
                lVar2 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_0018009f;
                child_critical_section->lock = (optimistic_lock *)0x0;
                goto LAB_0017ff5c;
              }
            }
            optimistic_lock::dec_read_lock_count(poVar9);
            node_critical_section->lock = (optimistic_lock *)0x0;
          }
        }
        else {
          *child_in_parent = piVar7;
          poVar9 = parent_critical_section->lock;
          if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00180080;
          if ((parent_critical_section->version).version ==
              (poVar9->version).version.super___atomic_base<unsigned_long>._M_i) {
            LOCK();
            paVar1 = &poVar9->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0018009f;
            parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_0017fda0:
            uVar8 = 0x100;
LAB_0017fec6:
            uVar5 = 1;
            goto LAB_0017ff62;
          }
LAB_0017ff79:
          optimistic_lock::dec_read_lock_count(poVar9);
          parent_critical_section->lock = (optimistic_lock *)0x0;
        }
      }
    }
  }
  uVar5 = 0;
  uVar8 = 0;
LAB_0017ff62:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar8 | uVar5);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}